

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_cache_mips64(CPUMIPSState_conflict5 *env,target_ulong addr,uint32_t op)

{
  uint local_30;
  uint local_2c;
  target_ulong index;
  uint32_t op_local;
  target_ulong addr_local;
  CPUMIPSState_conflict5 *env_local;
  
  if (op == 9) {
    memory_region_dispatch_write_mips64
              ((uc_struct_conflict6 *)env->uc,env->itc_tag,addr & 0x1fffffff,env->CP0_TagLo,MO_64,
               (MemTxAttrs)(local_2c & 0xff800000 | 1));
  }
  else if (op == 5) {
    memory_region_dispatch_read_mips64
              ((uc_struct_conflict6 *)env->uc,env->itc_tag,addr & 0x1fffffff,&env->CP0_TagLo,MO_64,
               (MemTxAttrs)(local_30 & 0xff800000 | 1));
  }
  return;
}

Assistant:

void helper_cache(CPUMIPSState *env, target_ulong addr, uint32_t op)
{
    target_ulong index = addr & 0x1fffffff;
    if (op == 9) {
        /* Index Store Tag */
        memory_region_dispatch_write(env->uc, env->itc_tag, index, env->CP0_TagLo,
                                     MO_64, MEMTXATTRS_UNSPECIFIED);
    } else if (op == 5) {
        /* Index Load Tag */
        memory_region_dispatch_read(env->uc, env->itc_tag, index, &env->CP0_TagLo,
                                    MO_64, MEMTXATTRS_UNSPECIFIED);
    }
}